

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_flush(CBB *cbb)

{
  CBB *pCVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  cbb_buffer_st *base_00;
  ulong uVar5;
  ulong local_50;
  size_t i;
  size_t extra_bytes;
  uint8_t initial_length_byte;
  ulong uStack_38;
  uint8_t len_len;
  size_t len;
  size_t child_start;
  cbb_child_st *child;
  cbb_buffer_st *base;
  CBB *cbb_local;
  
  base_00 = cbb_get_base(cbb);
  if ((base_00 == (cbb_buffer_st *)0x0) || (((byte)base_00->field_0x18 >> 1 & 1) != 0)) {
    return 0;
  }
  if (cbb->child == (CBB *)0x0) {
    return 1;
  }
  if (cbb->child->is_child == '\0') {
    __assert_fail("cbb->child->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0xc5,"int CBB_flush(CBB *)");
  }
  pCVar1 = cbb->child;
  if ((cbb_buffer_st *)(pCVar1->u).base.buf != base_00) {
    __assert_fail("child->base == base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,199,"int CBB_flush(CBB *)");
  }
  uVar5 = (pCVar1->u).base.len + (ulong)(pCVar1->u).child.pending_len_len;
  iVar4 = CBB_flush(cbb->child);
  if (((iVar4 != 0) && ((pCVar1->u).base.len <= uVar5)) && (uVar5 <= base_00->len)) {
    uStack_38 = base_00->len - uVar5;
    if ((*(byte *)((long)&pCVar1->u + 0x11) & 1) != 0) {
      if ((pCVar1->u).child.pending_len_len != '\x01') {
        __assert_fail("child->pending_len_len == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0xd9,"int CBB_flush(CBB *)");
      }
      if (0xfffffffe < uStack_38) {
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0xdc);
        goto LAB_001ed1d4;
      }
      if (uStack_38 < 0x1000000) {
        if (uStack_38 < 0x10000) {
          if (uStack_38 < 0x100) {
            if (uStack_38 < 0x80) {
              extra_bytes._7_1_ = 1;
              extra_bytes._6_1_ = (uint8_t)uStack_38;
              uStack_38 = 0;
            }
            else {
              extra_bytes._7_1_ = 2;
              extra_bytes._6_1_ = 0x81;
            }
          }
          else {
            extra_bytes._7_1_ = 3;
            extra_bytes._6_1_ = 0x82;
          }
        }
        else {
          extra_bytes._7_1_ = 4;
          extra_bytes._6_1_ = 0x83;
        }
      }
      else {
        extra_bytes._7_1_ = 5;
        extra_bytes._6_1_ = 0x84;
      }
      if (extra_bytes._7_1_ != 1) {
        iVar4 = cbb_buffer_add(base_00,(uint8_t **)0x0,(long)(int)(extra_bytes._7_1_ - 1));
        if (iVar4 == 0) goto LAB_001ed1d4;
        OPENSSL_memmove(base_00->buf + (long)(int)(extra_bytes._7_1_ - 1) + uVar5,
                        base_00->buf + uVar5,uStack_38);
      }
      puVar2 = base_00->buf;
      sVar3 = (pCVar1->u).base.len;
      (pCVar1->u).base.len = sVar3 + 1;
      puVar2[sVar3] = extra_bytes._6_1_;
      (pCVar1->u).child.pending_len_len = extra_bytes._7_1_ - 1;
    }
    for (local_50 = (ulong)(int)((pCVar1->u).child.pending_len_len - 1);
        local_50 < (pCVar1->u).child.pending_len_len; local_50 = local_50 - 1) {
      base_00->buf[(pCVar1->u).base.len + local_50] = (uint8_t)uStack_38;
      uStack_38 = uStack_38 >> 8;
    }
    if (uStack_38 == 0) {
      (pCVar1->u).base.buf = (uint8_t *)0x0;
      cbb->child = (CBB *)0x0;
      return 1;
    }
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x103);
  }
LAB_001ed1d4:
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_flush(CBB *cbb) {
  // If |base| has hit an error, the buffer is in an undefined state, so
  // fail all following calls. In particular, |cbb->child| may point to invalid
  // memory.
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  if (base == NULL || base->error) {
    return 0;
  }

  if (cbb->child == NULL) {
    // Nothing to flush.
    return 1;
  }

  assert(cbb->child->is_child);
  struct cbb_child_st *child = &cbb->child->u.child;
  assert(child->base == base);
  size_t child_start = child->offset + child->pending_len_len;

  size_t len;
  if (!CBB_flush(cbb->child) || child_start < child->offset ||
      base->len < child_start) {
    goto err;
  }

  len = base->len - child_start;

  if (child->pending_is_asn1) {
    // For ASN.1 we assume that we'll only need a single byte for the length.
    // If that turned out to be incorrect, we have to move the contents along
    // in order to make space.
    uint8_t len_len;
    uint8_t initial_length_byte;

    assert(child->pending_len_len == 1);

    if (len > 0xfffffffe) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      // Too large.
      goto err;
    } else if (len > 0xffffff) {
      len_len = 5;
      initial_length_byte = 0x80 | 4;
    } else if (len > 0xffff) {
      len_len = 4;
      initial_length_byte = 0x80 | 3;
    } else if (len > 0xff) {
      len_len = 3;
      initial_length_byte = 0x80 | 2;
    } else if (len > 0x7f) {
      len_len = 2;
      initial_length_byte = 0x80 | 1;
    } else {
      len_len = 1;
      initial_length_byte = (uint8_t)len;
      len = 0;
    }

    if (len_len != 1) {
      // We need to move the contents along in order to make space.
      size_t extra_bytes = len_len - 1;
      if (!cbb_buffer_add(base, NULL, extra_bytes)) {
        goto err;
      }
      OPENSSL_memmove(base->buf + child_start + extra_bytes,
                      base->buf + child_start, len);
    }
    base->buf[child->offset++] = initial_length_byte;
    child->pending_len_len = len_len - 1;
  }

  for (size_t i = child->pending_len_len - 1; i < child->pending_len_len; i--) {
    base->buf[child->offset + i] = (uint8_t)len;
    len >>= 8;
  }
  if (len != 0) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    goto err;
  }

  child->base = NULL;
  cbb->child = NULL;

  return 1;

err:
  cbb_on_error(cbb);
  return 0;
}